

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommandArguments.cxx
# Opt level: O0

string * __thiscall
cmInstallCommandArguments::GetComponent_abi_cxx11_(cmInstallCommandArguments *this)

{
  int iVar1;
  ulong uVar2;
  allocator local_19;
  cmInstallCommandArguments *local_18;
  cmInstallCommandArguments *this_local;
  
  local_18 = this;
  cmCAString::GetString_abi_cxx11_(&this->Component);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    this_local = (cmInstallCommandArguments *)cmCAString::GetString_abi_cxx11_(&this->Component);
  }
  else if (this->GenericArguments == (cmInstallCommandArguments *)0x0) {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      this_local = (cmInstallCommandArguments *)&this->DefaultComponentName;
    }
    else {
      if (GetComponent[abi:cxx11]()::unspecifiedComponent_abi_cxx11_ == '\0') {
        iVar1 = __cxa_guard_acquire(&GetComponent[abi:cxx11]()::unspecifiedComponent_abi_cxx11_);
        if (iVar1 != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&GetComponent[abi:cxx11]()::unspecifiedComponent_abi_cxx11_,
                     "Unspecified",&local_19);
          std::allocator<char>::~allocator((allocator<char> *)&local_19);
          __cxa_atexit(std::__cxx11::string::~string,
                       &GetComponent[abi:cxx11]()::unspecifiedComponent_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&GetComponent[abi:cxx11]()::unspecifiedComponent_abi_cxx11_);
        }
      }
      this_local = (cmInstallCommandArguments *)
                   &GetComponent[abi:cxx11]()::unspecifiedComponent_abi_cxx11_;
    }
  }
  else {
    this_local = (cmInstallCommandArguments *)GetComponent_abi_cxx11_(this->GenericArguments);
  }
  return (string *)this_local;
}

Assistant:

const std::string& cmInstallCommandArguments::GetComponent() const
{
  if (!this->Component.GetString().empty()) {
    return this->Component.GetString();
  }
  if (this->GenericArguments != CM_NULLPTR) {
    return this->GenericArguments->GetComponent();
  }
  if (!this->DefaultComponentName.empty()) {
    return this->DefaultComponentName;
  }
  static std::string unspecifiedComponent = "Unspecified";
  return unspecifiedComponent;
}